

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarInduction(Abc_Ntk_t *pNtk,int nTimeOut,int nFramesMax,int nConfMax,int fUnique,
                       int fUniqueAll,int fGetCex,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  abctime aVar2;
  Aig_Man_t *p;
  abctime aVar3;
  char *pcVar4;
  char *format;
  int level;
  Aig_Man_t *pAVar5;
  
  aVar2 = Abc_Clock();
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    iVar1 = -1;
  }
  else {
    pAVar5 = p;
    iVar1 = Saig_ManInduction(p,nTimeOut,nFramesMax,nConfMax,fUnique,fUniqueAll,fGetCex,fVerbose,
                              fVeryVerbose);
    level = (int)pAVar5;
    pcVar4 = "Networks are UNDECIDED.  ";
    if (iVar1 == 0) {
      pcVar4 = "Networks are NOT EQUIVALENT.  ";
    }
    format = "Networks are equivalent.  ";
    if (iVar1 != 1) {
      format = pcVar4;
    }
    Abc_Print(level,format);
    Abc_Print(level,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
    if (fGetCex != 0) {
      if (pNtk->pModel != (int *)0x0) {
        free(pNtk->pModel);
        pNtk->pModel = (int *)0x0;
      }
      free(pNtk->pSeqModel);
      pNtk->pSeqModel = p->pSeqModel;
      p->pSeqModel = (Abc_Cex_t *)0x0;
    }
    Aig_ManStop(p);
  }
  return iVar1;
}

Assistant:

int Abc_NtkDarInduction( Abc_Ntk_t * pNtk, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose )
{ 
    Aig_Man_t * pMan;
    abctime clkTotal = Abc_Clock();
    int RetValue;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return -1;
    RetValue = Saig_ManInduction( pMan, nTimeOut, nFramesMax, nConfMax, fUnique, fUniqueAll, fGetCex, fVerbose, fVeryVerbose );
    if ( RetValue == 1 )
    {
        Abc_Print( 1, "Networks are equivalent.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        Abc_Print( 1, "Networks are NOT EQUIVALENT.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else
    {
        Abc_Print( 1, "Networks are UNDECIDED.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    if ( fGetCex )
    {
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    }
    Aig_ManStop( pMan );
    return RetValue;
}